

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O1

bool __thiscall
cmGlobalKdevelopGenerator::CreateFilelistFile
          (cmGlobalKdevelopGenerator *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *lgs,string *outputDir,
          string *projectDirIn,string *projectname,string *cmakeFilePattern,string *fileToOpen)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  cmMakefile *this_00;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  char *pcVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  size_type *psVar11;
  long *plVar12;
  pointer ppcVar13;
  _Alloc_hider _Var14;
  pointer pbVar15;
  _Self __tmp;
  bool bVar16;
  string projectDir;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  string tmp;
  string filename;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ifstream oldFilelist;
  cmGeneratedFileStream fout;
  allocator local_571;
  _Hash_node_base *local_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  string local_548;
  string local_528;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_508;
  long *local_500;
  long local_4f8;
  long local_4f0;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  string *local_4e0;
  pointer local_4d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4d0;
  string local_4a0;
  string local_480;
  byte abStack_460 [488];
  undefined1 local_278 [32];
  uint auStack_258 [138];
  
  local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
  pcVar1 = (projectDirIn->_M_dataplus)._M_p;
  local_508 = lgs;
  local_4e0 = cmakeFilePattern;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_568,pcVar1,pcVar1 + projectDirIn->_M_string_length);
  std::__cxx11::string::append((char *)&local_568);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  pcVar1 = (outputDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,pcVar1,pcVar1 + outputDir->_M_string_length);
  std::__cxx11::string::append((char *)&local_480);
  plVar7 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_480,(ulong)(projectname->_M_dataplus)._M_p);
  psVar11 = (size_type *)(plVar7 + 2);
  if ((size_type *)*plVar7 == psVar11) {
    local_278._16_8_ = *psVar11;
    local_278._24_8_ = plVar7[3];
    local_278._0_8_ = local_278 + 0x10;
  }
  else {
    local_278._16_8_ = *psVar11;
    local_278._0_8_ = (size_type *)*plVar7;
  }
  local_278._8_8_ = plVar7[1];
  *plVar7 = (long)psVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  plVar7 = (long *)std::__cxx11::string::append(local_278);
  local_500 = &local_4f0;
  plVar12 = plVar7 + 2;
  if ((long *)*plVar7 == plVar12) {
    local_4f0 = *plVar12;
    uStack_4e8 = (undefined4)plVar7[3];
    uStack_4e4 = *(undefined4 *)((long)plVar7 + 0x1c);
  }
  else {
    local_4f0 = *plVar12;
    local_500 = (long *)*plVar7;
  }
  local_4f8 = plVar7[1];
  *plVar7 = (long)plVar12;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  local_4d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4d0._M_impl.super__Rb_tree_header._M_header;
  local_4d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
  local_528._M_string_length = 0;
  local_528.field_2._M_local_buf[0] = '\0';
  ppcVar13 = (local_508->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  local_4d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4d0._M_impl.super__Rb_tree_header._M_header._M_left;
  if (ppcVar13 !=
      (local_508->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = (*ppcVar13)->Makefile;
      local_4d8 = ppcVar13;
      for (pbVar15 = (pcVar2->ListFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar15 !=
          (pcVar2->ListFiles).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
        std::__cxx11::string::_M_assign((string *)&local_528);
        cmsys::SystemTools::ReplaceString(&local_528,local_568._M_dataplus._M_p,"");
        if ((*local_528._M_dataplus._M_p != '/') &&
           (pcVar8 = strstr(local_528._M_dataplus._M_p,"CMakeFiles/"), pcVar8 == (char *)0x0)) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_4d0,&local_528);
          cmsys::SystemTools::GetFilenameName((string *)local_278,&local_528);
          std::__cxx11::string::operator=((string *)&local_528,(string *)local_278);
          if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
            operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
          }
          iVar6 = std::__cxx11::string::compare((char *)&local_528);
          _Var14._M_p = local_528._M_dataplus._M_p;
          if ((iVar6 != 0) &&
             (pcVar8 = strstr(local_528._M_dataplus._M_p,".cmake"), pcVar8 == (char *)0x0)) {
            local_278._0_8_ = local_278 + 0x10;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_278,_Var14._M_p,_Var14._M_p + local_528._M_string_length);
            std::__cxx11::string::append((char *)local_278);
            std::__cxx11::string::_M_append((char *)local_4e0,local_278._0_8_);
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
            }
          }
        }
      }
      p_Var4 = (pcVar2->Targets)._M_h._M_before_begin._M_nxt;
      p_Var3 = local_570;
      while (local_570 = p_Var4, local_570 != (_Hash_node_base *)0x0) {
        local_548._M_dataplus._M_p = (pointer)0x0;
        local_548._M_string_length = 0;
        local_548.field_2._M_allocated_capacity = 0;
        this_00 = (cmMakefile *)local_570[0x5f]._M_nxt;
        local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_480,"CMAKE_BUILD_TYPE","");
        pcVar8 = cmMakefile::GetSafeDefinition(this_00,&local_480);
        std::__cxx11::string::string((string *)local_278,pcVar8,&local_571);
        cmTarget::GetSourceFiles
                  ((cmTarget *)(local_570 + 5),
                   (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&local_548,
                   (string *)local_278);
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_480._M_dataplus._M_p != &local_480.field_2) {
          operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
        }
        _Var14._M_p = local_548._M_dataplus._M_p;
        if (local_548._M_dataplus._M_p != (pointer)local_548._M_string_length) {
          do {
            cmSourceFile::GetFullPath(*(cmSourceFile **)_Var14._M_p,(string *)0x0);
            std::__cxx11::string::_M_assign((string *)&local_528);
            cmsys::SystemTools::GetFilenamePath((string *)local_278,&local_528);
            std::__cxx11::string::append((char *)local_278);
            cmsys::SystemTools::GetFilenameWithoutExtension(&local_480,&local_528);
            std::__cxx11::string::_M_append((char *)local_278,(ulong)local_480._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_480._M_dataplus._M_p != &local_480.field_2) {
              operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1
                             );
            }
            cmsys::SystemTools::ReplaceString(&local_528,local_568._M_dataplus._M_p,"");
            if ((*local_528._M_dataplus._M_p == '/') ||
               (pcVar8 = strstr(local_528._M_dataplus._M_p,"CMakeFiles/"), pcVar8 != (char *)0x0)) {
              bVar5 = false;
              bVar16 = false;
            }
            else {
              cmsys::SystemTools::GetFilenameExtension(&local_4a0,&local_528);
              iVar6 = std::__cxx11::string::compare((char *)&local_4a0);
              bVar16 = iVar6 != 0;
              bVar5 = true;
            }
            if ((bVar5) &&
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4a0._M_dataplus._M_p != &local_4a0.field_2)) {
              operator_delete(local_4a0._M_dataplus._M_p,local_4a0.field_2._M_allocated_capacity + 1
                             );
            }
            if (bVar16) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_4d0,&local_528);
              for (pbVar15 = (pcVar2->HeaderFileExtensions).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                  pbVar15 !=
                  (pcVar2->HeaderFileExtensions).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar15 = pbVar15 + 1) {
                local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_480,local_278._0_8_,
                           (char *)(local_278._0_8_ + local_278._8_8_));
                std::__cxx11::string::append((char *)&local_480);
                std::__cxx11::string::_M_append
                          ((char *)&local_480,(ulong)(pbVar15->_M_dataplus)._M_p);
                bVar5 = cmsys::SystemTools::FileExists(local_480._M_dataplus._M_p);
                if (bVar5) {
                  cmsys::SystemTools::ReplaceString(&local_480,local_568._M_dataplus._M_p,"");
                  std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string_const&>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_4d0,&local_480);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_480._M_dataplus._M_p != &local_480.field_2) {
                    operator_delete(local_480._M_dataplus._M_p,
                                    local_480.field_2._M_allocated_capacity + 1);
                  }
                  if (bVar5) break;
                }
                else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_480._M_dataplus._M_p != &local_480.field_2) {
                  operator_delete(local_480._M_dataplus._M_p,
                                  local_480.field_2._M_allocated_capacity + 1);
                }
              }
            }
            if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
              operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
            }
            _Var14._M_p = _Var14._M_p + 8;
          } while (_Var14._M_p != (pointer)local_548._M_string_length);
        }
        pbVar15 = (pcVar2->ListFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pbVar15 !=
            (pcVar2->ListFiles).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          do {
            std::__cxx11::string::_M_assign((string *)&local_528);
            cmsys::SystemTools::ReplaceString(&local_528,local_568._M_dataplus._M_p,"");
            if ((*local_528._M_dataplus._M_p != '/') &&
               (pcVar8 = strstr(local_528._M_dataplus._M_p,"CMakeFiles/"), pcVar8 == (char *)0x0)) {
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_4d0,&local_528);
            }
            pbVar15 = pbVar15 + 1;
          } while (pbVar15 !=
                   (pcVar2->ListFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        if (local_548._M_dataplus._M_p != (pointer)0x0) {
          operator_delete(local_548._M_dataplus._M_p,
                          local_548.field_2._M_allocated_capacity - (long)local_548._M_dataplus._M_p
                         );
        }
        p_Var3 = local_570;
        p_Var4 = local_570->_M_nxt;
      }
      ppcVar13 = local_4d8 + 1;
      local_570 = p_Var3;
    } while (ppcVar13 !=
             (local_508->super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  }
  std::ifstream::ifstream(&local_480,(char *)local_500,_S_in);
  if ((abStack_460[*(long *)(local_480._M_dataplus._M_p + -0x18)] & 5) == 0) {
    while (bVar5 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_480,&local_528,(bool *)0x0,-1), bVar5) {
      if (*local_528._M_dataplus._M_p != '/') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_278,&local_568,&local_528);
        bVar5 = cmsys::SystemTools::FileExists((char *)local_278._0_8_);
        if (bVar5) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_4d0,&local_528);
        }
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
      }
    }
    std::ifstream::close();
  }
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(char *)local_500,false);
  local_570 = (_Hash_node_base *)
              CONCAT44(local_570._4_4_,
                       *(uint *)((long)auStack_258 + *(long *)(local_278._0_8_ + -0x18)));
  if (((*(uint *)((long)auStack_258 + *(long *)(local_278._0_8_ + -0x18)) & 5) == 0) &&
     (std::__cxx11::string::_M_replace
                ((ulong)fileToOpen,0,(char *)fileToOpen->_M_string_length,0x4fcadd),
     (_Rb_tree_header *)local_4d0._M_impl.super__Rb_tree_header._M_header._M_left !=
     &local_4d0._M_impl.super__Rb_tree_header)) {
    p_Var10 = local_4d0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      cmsys::SystemTools::CollapseFullPath
                (&local_548,(string *)(p_Var10 + 1),local_568._M_dataplus._M_p);
      std::__cxx11::string::operator=((string *)&local_528,(string *)&local_548);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
      }
      if (fileToOpen->_M_string_length == 0) {
        cmsys::SystemTools::GetFilenameExtension(&local_548,&local_528);
        iVar6 = std::__cxx11::string::compare((char *)&local_548);
        if (((((iVar6 == 0) ||
              (iVar6 = std::__cxx11::string::compare((char *)&local_548), iVar6 == 0)) ||
             (iVar6 = std::__cxx11::string::compare((char *)&local_548), iVar6 == 0)) ||
            ((iVar6 = std::__cxx11::string::compare((char *)&local_548), iVar6 == 0 ||
             (iVar6 = std::__cxx11::string::compare((char *)&local_548), iVar6 == 0)))) ||
           ((iVar6 = std::__cxx11::string::compare((char *)&local_548), iVar6 == 0 ||
            (iVar6 = std::__cxx11::string::compare((char *)&local_548), iVar6 == 0)))) {
          std::__cxx11::string::_M_assign((string *)fileToOpen);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_548._M_dataplus._M_p != &local_548.field_2) {
          operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
        }
      }
      cmsys::SystemTools::ReplaceString(&local_528,local_568._M_dataplus._M_p,"");
      _Var14._M_p = local_528._M_dataplus._M_p;
      if ((local_528._M_string_length != 0) && (*local_528._M_dataplus._M_p != '/')) {
        sVar9 = strlen(local_528._M_dataplus._M_p);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,_Var14._M_p,sVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
      }
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    } while ((_Rb_tree_header *)p_Var10 != &local_4d0._M_impl.super__Rb_tree_header);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  std::ifstream::~ifstream(&local_480);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_528._M_dataplus._M_p != &local_528.field_2) {
    operator_delete(local_528._M_dataplus._M_p,
                    CONCAT71(local_528.field_2._M_allocated_capacity._1_7_,
                             local_528.field_2._M_local_buf[0]) + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_4d0);
  if (local_500 != &local_4f0) {
    operator_delete(local_500,local_4f0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_568._M_dataplus._M_p != &local_568.field_2) {
    operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
  }
  return ((ulong)local_570 & 5) == 0;
}

Assistant:

bool cmGlobalKdevelopGenerator
::CreateFilelistFile(const std::vector<cmLocalGenerator*>& lgs,
                     const std::string& outputDir,
                     const std::string& projectDirIn,
                     const std::string& projectname,
                     std::string& cmakeFilePattern,
                     std::string& fileToOpen)
{
  std::string projectDir = projectDirIn + "/";
  std::string filename = outputDir+ "/" + projectname +".kdevelop.filelist";

  std::set<std::string> files;
  std::string tmp;

  for (std::vector<cmLocalGenerator*>::const_iterator it=lgs.begin();
       it!=lgs.end(); it++)
    {
    cmMakefile* makefile=(*it)->GetMakefile();
    const std::vector<std::string>& listFiles=makefile->GetListFiles();
    for (std::vector<std::string>::const_iterator lt=listFiles.begin();
         lt!=listFiles.end(); lt++)
      {
      tmp=*lt;
      cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
      // make sure the file is part of this source tree
      if ((tmp[0]!='/') &&
          (strstr(tmp.c_str(),
                  cmake::GetCMakeFilesDirectoryPostSlash())==0))
        {
        files.insert(tmp);
        tmp=cmSystemTools::GetFilenameName(tmp);
        //add all files which dont match the default
        // */CMakeLists.txt;*cmake; to the file pattern
        if ((tmp!="CMakeLists.txt")
            && (strstr(tmp.c_str(), ".cmake")==0))
          {
          cmakeFilePattern+=tmp+";";
          }
        }
      }

    //get all sources
    cmTargets& targets=makefile->GetTargets();
    for (cmTargets::iterator ti = targets.begin();
         ti != targets.end(); ti++)
      {
      std::vector<cmSourceFile*> sources;
      ti->second.GetSourceFiles(sources, ti->second.GetMakefile()
                                    ->GetSafeDefinition("CMAKE_BUILD_TYPE"));
      for (std::vector<cmSourceFile*>::const_iterator si=sources.begin();
           si!=sources.end(); si++)
        {
        tmp=(*si)->GetFullPath();
        std::string headerBasename=cmSystemTools::GetFilenamePath(tmp);
        headerBasename+="/";
        headerBasename+=cmSystemTools::GetFilenameWithoutExtension(tmp);

        cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");

        if ((tmp[0]!='/')  &&
            (strstr(tmp.c_str(),
                  cmake::GetCMakeFilesDirectoryPostSlash())==0) &&
           (cmSystemTools::GetFilenameExtension(tmp)!=".moc"))
          {
          files.insert(tmp);

          // check if there's a matching header around
          for(std::vector<std::string>::const_iterator
                ext = makefile->GetHeaderExtensions().begin();
              ext !=  makefile->GetHeaderExtensions().end(); ++ext)
            {
            std::string hname=headerBasename;
            hname += ".";
            hname += *ext;
            if(cmSystemTools::FileExists(hname.c_str()))
              {
              cmSystemTools::ReplaceString(hname, projectDir.c_str(), "");
              files.insert(hname);
              break;
              }
            }
          }
        }
      for (std::vector<std::string>::const_iterator lt=listFiles.begin();
           lt!=listFiles.end(); lt++)
        {
        tmp=*lt;
        cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
        if ((tmp[0]!='/') &&
            (strstr(tmp.c_str(),
                    cmake::GetCMakeFilesDirectoryPostSlash())==0))
          {
          files.insert(tmp);
          }
        }
      }
    }

  //check if the output file already exists and read it
  //insert all files which exist into the set of files
  cmsys::ifstream oldFilelist(filename.c_str());
  if (oldFilelist)
    {
    while (cmSystemTools::GetLineFromStream(oldFilelist, tmp))
      {
      if (tmp[0]=='/')
        {
        continue;
        }
      std::string completePath=projectDir+tmp;
      if (cmSystemTools::FileExists(completePath.c_str()))
        {
        files.insert(tmp);
        }
      }
    oldFilelist.close();
    }

  //now write the new filename
  cmGeneratedFileStream fout(filename.c_str());
  if(!fout)
    {
    return false;
    }

  fileToOpen="";
  for (std::set<std::string>::const_iterator it=files.begin();
       it!=files.end(); it++)
    {
    // get the full path to the file
    tmp=cmSystemTools::CollapseFullPath(*it, projectDir.c_str());
    // just select the first source file
    if (fileToOpen.empty())
    {
       std::string ext = cmSystemTools::GetFilenameExtension(tmp);
       if ((ext==".c") || (ext==".cc") || (ext==".cpp")  || (ext==".cxx")
           || (ext==".C") || (ext==".h") || (ext==".hpp"))
       {
       fileToOpen=tmp;
       }
    }
    // make it relative to the project dir
    cmSystemTools::ReplaceString(tmp, projectDir.c_str(), "");
    // only put relative paths
    if (!tmp.empty() && tmp[0] != '/')
      {
      fout << tmp.c_str() <<"\n";
      }
    }
  return true;
}